

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

void alsa_set_stream_state(cubeb_stream_conflict1 *stm,stream_state state)

{
  long lVar1;
  undefined4 in_ESI;
  long *in_RDI;
  int r;
  cubeb_conflict1 *ctx;
  
  lVar1 = *in_RDI;
  *(undefined4 *)(in_RDI + 0x16) = in_ESI;
  pthread_cond_broadcast((pthread_cond_t *)(in_RDI + 0x10));
  *(undefined4 *)(lVar1 + 0xd0) = 1;
  poll_wake((cubeb_conflict1 *)0x13d8b7);
  return;
}

Assistant:

static void
alsa_set_stream_state(cubeb_stream * stm, enum stream_state state)
{
  cubeb * ctx;
  int r;

  ctx = stm->context;
  stm->state = state;
  r = pthread_cond_broadcast(&stm->cond);
  assert(r == 0);
  ctx->rebuild = 1;
  poll_wake(ctx);
}